

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_buffer.cc
# Opt level: O1

result __thiscall
dtc::anon_unknown_1::divmod<std::divides<unsigned_long_long>_>::operator()
          (divmod<std::divides<unsigned_long_long>_> *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar5;
  byte extraout_DL;
  uint extraout_EDX;
  ulong extraout_RDX;
  undefined8 uVar6;
  result rVar7;
  
  iVar3 = (**((this->super_binary_operator<5,_std::divides<unsigned_long_long>_>).
              super_binary_operator_base.rhs._M_t.
              super___uniq_ptr_impl<dtc::(anonymous_namespace)::expression,_std::default_delete<dtc::(anonymous_namespace)::expression>_>
              ._M_t.
              super__Tuple_impl<0UL,_dtc::(anonymous_namespace)::expression_*,_std::default_delete<dtc::(anonymous_namespace)::expression>_>
              .super__Head_base<0UL,_dtc::(anonymous_namespace)::expression_*,_false>._M_head_impl)
             ->_vptr_expression)();
  if ((CONCAT44(extraout_var,iVar3) == 0 & extraout_DL) == 1) {
    text_input_buffer::source_location::report_error
              (&(this->super_binary_operator<5,_std::divides<unsigned_long_long>_>).
                super_binary_operator_base.super_expression.loc,"Division by zero");
  }
  else {
    iVar3 = (**((this->super_binary_operator<5,_std::divides<unsigned_long_long>_>).
                super_binary_operator_base.lhs._M_t.
                super___uniq_ptr_impl<dtc::(anonymous_namespace)::expression,_std::default_delete<dtc::(anonymous_namespace)::expression>_>
                ._M_t.
                super__Tuple_impl<0UL,_dtc::(anonymous_namespace)::expression_*,_std::default_delete<dtc::(anonymous_namespace)::expression>_>
                .super__Head_base<0UL,_dtc::(anonymous_namespace)::expression_*,_false>._M_head_impl
               )->_vptr_expression)();
    iVar4 = (**((this->super_binary_operator<5,_std::divides<unsigned_long_long>_>).
                super_binary_operator_base.rhs._M_t.
                super___uniq_ptr_impl<dtc::(anonymous_namespace)::expression,_std::default_delete<dtc::(anonymous_namespace)::expression>_>
                ._M_t.
                super__Tuple_impl<0UL,_dtc::(anonymous_namespace)::expression_*,_std::default_delete<dtc::(anonymous_namespace)::expression>_>
                .super__Head_base<0UL,_dtc::(anonymous_namespace)::expression_*,_false>._M_head_impl
               )->_vptr_expression)();
    if (((extraout_EDX & 1) != 0) && ((extraout_RDX & 1) != 0)) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = CONCAT44(extraout_var_01,iVar4);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = CONCAT44(extraout_var_00,iVar3);
      uVar5 = CONCAT44(extraout_var_00,iVar3) / CONCAT44(extraout_var_01,iVar4);
      uVar6 = CONCAT71(SUB167(auVar2 % auVar1,1),1);
      goto LAB_00138840;
    }
  }
  uVar5 = 0;
  uVar6 = 0;
LAB_00138840:
  rVar7._8_8_ = uVar6;
  rVar7.first = uVar5;
  return rVar7;
}

Assistant:

result operator()() override
	{
		result r = (*binary_operator_base::rhs)();
		if (r.second && (r.first == 0))
		{
			expression::loc.report_error("Division by zero");
			return {0, false};
		}
		return binary_operator<5, T>::operator()();
	}